

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::AssertionStats::AssertionStats
          (AssertionStats *this,AssertionResult *_assertionResult,
          vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *_infoMessages,
          Totals *_totals)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OfType OVar2;
  pointer pcVar3;
  char *pcVar4;
  size_type sVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  size_type sVar18;
  int iVar19;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar20;
  long *local_c0;
  long local_b8;
  long local_b0 [2];
  size_t local_a0;
  char *local_98;
  ReusableStringStream local_90;
  value_type local_78;
  
  this->_vptr_AssertionStats = (_func_int **)&PTR__AssertionStats_001c0270;
  uVar6 = *(undefined4 *)((long)&(_assertionResult->m_info).macroName.m_start + 4);
  sVar5 = (_assertionResult->m_info).macroName.m_size;
  uVar7 = *(undefined4 *)((long)&(_assertionResult->m_info).macroName.m_size + 4);
  uVar8 = *(undefined4 *)&(_assertionResult->m_info).lineInfo.file;
  uVar9 = *(undefined4 *)((long)&(_assertionResult->m_info).lineInfo.file + 4);
  sVar17 = (_assertionResult->m_info).lineInfo.line;
  uVar10 = *(undefined4 *)((long)&(_assertionResult->m_info).lineInfo.line + 4);
  uVar11 = *(undefined4 *)&(_assertionResult->m_info).capturedExpression.m_start;
  uVar12 = *(undefined4 *)((long)&(_assertionResult->m_info).capturedExpression.m_start + 4);
  sVar18 = (_assertionResult->m_info).capturedExpression.m_size;
  uVar13 = *(undefined4 *)((long)&(_assertionResult->m_info).capturedExpression.m_size + 4);
  *(undefined4 *)&(this->assertionResult).m_info.macroName.m_start =
       *(undefined4 *)&(_assertionResult->m_info).macroName.m_start;
  *(undefined4 *)((long)&(this->assertionResult).m_info.macroName.m_start + 4) = uVar6;
  *(int *)&(this->assertionResult).m_info.macroName.m_size = (int)sVar5;
  *(undefined4 *)((long)&(this->assertionResult).m_info.macroName.m_size + 4) = uVar7;
  *(undefined4 *)&(this->assertionResult).m_info.lineInfo.file = uVar8;
  *(undefined4 *)((long)&(this->assertionResult).m_info.lineInfo.file + 4) = uVar9;
  *(int *)&(this->assertionResult).m_info.lineInfo.line = (int)sVar17;
  *(undefined4 *)((long)&(this->assertionResult).m_info.lineInfo.line + 4) = uVar10;
  *(undefined4 *)&(this->assertionResult).m_info.capturedExpression.m_start = uVar11;
  *(undefined4 *)((long)&(this->assertionResult).m_info.capturedExpression.m_start + 4) = uVar12;
  *(int *)&(this->assertionResult).m_info.capturedExpression.m_size = (int)sVar18;
  *(undefined4 *)((long)&(this->assertionResult).m_info.capturedExpression.m_size + 4) = uVar13;
  uVar6 = *(undefined4 *)&(_assertionResult->m_info).field_0x34;
  (this->assertionResult).m_info.resultDisposition = (_assertionResult->m_info).resultDisposition;
  *(undefined4 *)&(this->assertionResult).m_info.field_0x34 = uVar6;
  (this->assertionResult).m_resultData.message._M_dataplus._M_p =
       (pointer)&(this->assertionResult).m_resultData.message.field_2;
  pcVar3 = (_assertionResult->m_resultData).message._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->assertionResult).m_resultData,pcVar3,
             pcVar3 + (_assertionResult->m_resultData).message._M_string_length);
  (this->assertionResult).m_resultData.reconstructedExpression._M_dataplus._M_p =
       (pointer)&(this->assertionResult).m_resultData.reconstructedExpression.field_2;
  pcVar3 = (_assertionResult->m_resultData).reconstructedExpression._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->assertionResult).m_resultData.reconstructedExpression,pcVar3,
             pcVar3 + (_assertionResult->m_resultData).reconstructedExpression._M_string_length);
  (this->assertionResult).m_resultData.lazyExpression.m_transientExpression =
       (ITransientExpression *)0x0;
  (this->assertionResult).m_resultData.lazyExpression.m_isNegated =
       (_assertionResult->m_resultData).lazyExpression.m_isNegated;
  (this->assertionResult).m_resultData.resultType = (_assertionResult->m_resultData).resultType;
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&this->infoMessages,_infoMessages);
  (this->totals).testCases.failedButOk = (_totals->testCases).failedButOk;
  iVar19 = _totals->error;
  uVar6 = *(undefined4 *)&_totals->field_0x4;
  sVar17 = (_totals->assertions).passed;
  sVar14 = (_totals->assertions).failed;
  sVar15 = (_totals->assertions).failedButOk;
  sVar16 = (_totals->testCases).failed;
  (this->totals).testCases.passed = (_totals->testCases).passed;
  (this->totals).testCases.failed = sVar16;
  (this->totals).assertions.failed = sVar14;
  (this->totals).assertions.failedButOk = sVar15;
  (this->totals).error = iVar19;
  *(undefined4 *)&(this->totals).field_0x4 = uVar6;
  (this->totals).assertions.passed = sVar17;
  (this->assertionResult).m_resultData.lazyExpression.m_transientExpression =
       (_assertionResult->m_resultData).lazyExpression.m_transientExpression;
  if ((this->assertionResult).m_resultData.message._M_string_length != 0) {
    pcVar4 = (this->assertionResult).m_info.macroName.m_start;
    sVar5 = (this->assertionResult).m_info.macroName.m_size;
    local_98 = (this->assertionResult).m_info.lineInfo.file;
    local_a0 = (this->assertionResult).m_info.lineInfo.line;
    OVar2 = (this->assertionResult).m_resultData.resultType;
    local_90.super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__ReusableStringStream_001c07f8
    ;
    pSVar20 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
              getInternal();
    local_90.m_index = StringStreams::add(&pSVar20->super_StringStreams);
    pSVar20 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
              getInternal();
    paVar1 = &local_78.message.field_2;
    local_90.m_oss =
         *(ostream **)
          &(pSVar20->super_StringStreams).m_streams.
           super__Vector_base<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[local_90.m_index]._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    local_78.message._M_string_length = 0;
    local_78.message.field_2._M_local_buf[0] = '\0';
    local_78.lineInfo.file = local_98;
    local_78.lineInfo.line = local_a0;
    MessageInfo::globalCount = MessageInfo::globalCount + 1;
    pcVar3 = (this->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_c0 = local_b0;
    local_78.macroName.m_start = pcVar4;
    local_78.macroName.m_size = sVar5;
    local_78.message._M_dataplus._M_p = (pointer)paVar1;
    local_78.type = OVar2;
    local_78.sequence = MessageInfo::globalCount;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar3,
               pcVar3 + (this->assertionResult).m_resultData.message._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(local_90.m_oss,(char *)local_c0,local_b8);
    if (local_c0 != local_b0) {
      operator_delete(local_c0,local_b0[0] + 1);
    }
    std::__cxx11::stringbuf::str();
    Catch::AssertionStats();
    clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::push_back
              (&this->infoMessages,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.message._M_dataplus._M_p != paVar1) {
      operator_delete(local_78.message._M_dataplus._M_p,
                      CONCAT71(local_78.message.field_2._M_allocated_capacity._1_7_,
                               local_78.message.field_2._M_local_buf[0]) + 1);
    }
    ReusableStringStream::~ReusableStringStream(&local_90);
  }
  return;
}

Assistant:

AssertionStats::AssertionStats( AssertionResult const& _assertionResult,
                                     std::vector<MessageInfo> const& _infoMessages,
                                     Totals const& _totals )
    :   assertionResult( _assertionResult ),
        infoMessages( _infoMessages ),
        totals( _totals )
    {
        assertionResult.m_resultData.lazyExpression.m_transientExpression = _assertionResult.m_resultData.lazyExpression.m_transientExpression;

        if( assertionResult.hasMessage() ) {
            // Copy message into messages list.
            // !TBD This should have been done earlier, somewhere
            MessageBuilder builder( assertionResult.getTestMacroName(), assertionResult.getSourceInfo(), assertionResult.getResultType() );
            builder << assertionResult.getMessage();
            builder.m_info.message = builder.m_stream.str();

            infoMessages.push_back( builder.m_info );
        }
    }